

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
* __thiscall
gl3cts::ReservedNamesTest::getSupportedShaderTypes
          (vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
           *__return_storage_ptr__,ReservedNamesTest *this)

{
  bool bVar1;
  RenderContext *pRVar2;
  value_type local_5c [3];
  deUint32 local_50;
  ApiType local_4c;
  value_type local_48;
  deUint32 local_44;
  ApiType local_40;
  value_type local_3c [5];
  deUint32 local_28;
  ApiType local_24;
  undefined1 local_1d;
  deUint32 local_1c;
  ReservedNamesTest *pRStack_18;
  ContextType context_type;
  ReservedNamesTest *this_local;
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  *result;
  
  pRStack_18 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_1c = (*pRVar2->_vptr_RenderContext[2])();
  local_1d = 0;
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::vector(__return_storage_ptr__);
  local_24.m_bits = local_1c;
  local_28 = (deUint32)glu::ApiType::core(4,3);
  bVar1 = glu::contextSupports((ContextType)local_24.m_bits,(ApiType)local_28);
  if (bVar1) {
    local_3c[1] = 0;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::push_back(__return_storage_ptr__,local_3c + 1);
  }
  local_3c[0] = LANGUAGE_FEATURE_ATTRIBUTE;
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::push_back(__return_storage_ptr__,local_3c);
  local_40.m_bits = local_1c;
  local_44 = (deUint32)glu::ApiType::core(3,2);
  bVar1 = glu::contextSupports((ContextType)local_40.m_bits,(ApiType)local_44);
  if (bVar1) {
    local_48 = LANGUAGE_FEATURE_CONSTANT;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::push_back(__return_storage_ptr__,&local_48);
  }
  local_4c.m_bits = local_1c;
  local_50 = (deUint32)glu::ApiType::core(4,0);
  bVar1 = glu::contextSupports((ContextType)local_4c.m_bits,(ApiType)local_50);
  if (bVar1) {
    local_5c[2] = 3;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::push_back(__return_storage_ptr__,local_5c + 2);
    local_5c[1] = 4;
    std::
    vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
    ::push_back(__return_storage_ptr__,local_5c + 1);
  }
  local_5c[0] = LANGUAGE_FEATURE_INPUT;
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::push_back(__return_storage_ptr__,local_5c);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ReservedNamesTest::_shader_type> ReservedNamesTest::getSupportedShaderTypes() const
{
	const glu::ContextType	context_type = m_context.getRenderContext().getType();
	std::vector<_shader_type> result;

	/* CS: Available, starting with GL 4.3 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		result.push_back(SHADER_TYPE_COMPUTE);
	}

	/* FS: Always supported */
	result.push_back(SHADER_TYPE_FRAGMENT);

	/* GS: Available, starting with GL 3.2 */
	if (glu::contextSupports(context_type, glu::ApiType::core(3, 2)))
	{
		result.push_back(SHADER_TYPE_GEOMETRY);
	}

	/* TC: Available, starting with GL 4.0 */
	/* TE: Available, starting with GL 4.0 */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		result.push_back(SHADER_TYPE_TESS_CONTROL);
		result.push_back(SHADER_TYPE_TESS_EVALUATION);
	}

	/* VS: Always supported */
	result.push_back(SHADER_TYPE_VERTEX);

	return result;
}